

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O3

size_t buffer_writer_default(void **buf_addr,size_t len,void *opt)

{
  int __fd;
  ssize_t sVar1;
  ulong extraout_RAX;
  void *pvVar2;
  void *__buf;
  size_t sVar3;
  
  __fd = *opt;
  pvVar2 = *buf_addr;
  sVar3 = 0;
  __buf = pvVar2;
  do {
    while (sVar1 = write(__fd,__buf,len - sVar3), sVar1 == -1) {
      buffer_writer_default_cold_1();
      if ((extraout_RAX & 1) != 0) {
        pvVar2 = (void *)0x0;
        len = sVar3;
        goto LAB_00121f98;
      }
    }
    sVar3 = sVar3 + sVar1;
    __buf = (void *)((long)__buf + sVar1);
    if (sVar3 == len) {
LAB_00121f98:
      *buf_addr = pvVar2;
      return len;
    }
  } while( true );
}

Assistant:

static size_t buffer_writer_default(const void **buf_addr, size_t len,
				    void *opt)
{
  struct profile_ctx *ctx = opt;
  const int fd = ctx->fd;
  const void * const buf_start = *buf_addr;
  const void *data = *buf_addr;
  size_t write_total = 0;

  lj_assertX(len <= STREAM_BUFFER_SIZE, "stream buffer overflow");

  for (;;) {
    const ssize_t written = write(fd, data, len - write_total);

    if (LJ_UNLIKELY(written == -1)) {
      /* Re-tries write in case of EINTR. */
      if (errno != EINTR) {
  /* Will be freed as whole chunk later. */
  *buf_addr = NULL;
  return write_total;
      }

      errno = 0;
      continue;
    }

    write_total += written;
    lj_assertX(write_total <= len, "invalid stream buffer write");

    if (write_total == len)
      break;

    data = (uint8_t *)data + (ptrdiff_t)written;
  }

  *buf_addr = buf_start;
  return write_total;
}